

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O3

result_type_conflict2 __thiscall
trng::rayleigh_dist<double>::icdf(rayleigh_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  int *piVar2;
  double dVar3;
  result_type_conflict2 rVar4;
  
  if ((x < 0.0) || (1.0 < x)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    rVar4 = NAN;
  }
  else {
    dVar1 = (this->P).nu_;
    dVar3 = log(1.0 - x);
    dVar3 = dVar3 * -2.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    rVar4 = dVar1 * dVar3;
  }
  return rVar4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.nu() * math::sqrt(-2 * math::ln(1 - x));
    }